

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O0

void __thiscall Func::SetHasUnoptimizedArgumentsAccess(Func *this,bool args)

{
  Func *local_20;
  Func *curFunc;
  bool args_local;
  Func *this_local;
  
  if ((*(uint *)&this->field_0x240 >> 10 & 1) == 0) {
    *(uint *)&this->field_0x240 = *(uint *)&this->field_0x240 & 0xfffffbff | (uint)args << 10;
  }
  if (args) {
    for (local_20 = GetParentFunc(this); local_20 != (Func *)0x0; local_20 = GetParentFunc(local_20)
        ) {
      *(uint *)&local_20->field_0x240 =
           *(uint *)&local_20->field_0x240 & 0xfffffbff | (uint)args << 10;
    }
  }
  return;
}

Assistant:

void                SetHasUnoptimizedArgumentsAccess(bool args)
    {
                        // Once set to 'true' make sure this does not become false
                        if (!this->hasUnoptimizedArgumentsAccess)
                        {
                            this->hasUnoptimizedArgumentsAccess = args;
                        }

                        if (args)
                        {
                            Func *curFunc = this->GetParentFunc();
                            while (curFunc)
                            {
                                curFunc->hasUnoptimizedArgumentsAccess = args;
                                curFunc = curFunc->GetParentFunc();
                            }
                        }
    }